

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_xor.c
# Opt level: O0

_Bool array_array_container_lazy_xor
                (array_container_t *src_1,array_container_t *src_2,container_t **dst)

{
  long lVar1;
  long lVar2;
  int iVar3;
  array_container_t *paVar4;
  bitset_container_t *pbVar5;
  array_container_t *in_RDX;
  int *in_RSI;
  int *in_RDI;
  bitset_container_t *ourbitset;
  _Bool returnval;
  int totalCardinality;
  int32_t in_stack_ffffffffffffffcc;
  array_container_t *in_stack_ffffffffffffffd0;
  undefined4 *puVar6;
  undefined4 in_stack_ffffffffffffffd8;
  byte bVar7;
  _Bool local_1;
  
  iVar3 = *in_RDI + *in_RSI;
  if (iVar3 < 0x401) {
    paVar4 = array_container_create_given_capacity(in_stack_ffffffffffffffcc);
    *(array_container_t **)in_RDX = paVar4;
    lVar1._0_4_ = in_RDX->cardinality;
    lVar1._4_4_ = in_RDX->capacity;
    if (lVar1 != 0) {
      array_container_xor(in_RDX,(array_container_t *)CONCAT44(iVar3,in_stack_ffffffffffffffd8),
                          in_stack_ffffffffffffffd0);
    }
    local_1 = false;
  }
  else {
    pbVar5 = bitset_container_from_array(in_stack_ffffffffffffffd0);
    *(bitset_container_t **)in_RDX = pbVar5;
    bVar7 = 1;
    lVar2._0_4_ = in_RDX->cardinality;
    lVar2._4_4_ = in_RDX->capacity;
    if (lVar2 != 0) {
      puVar6 = *(undefined4 **)in_RDX;
      bitset_flip_list(*(uint64_t **)(puVar6 + 2),*(uint16_t **)(in_RSI + 2),(long)*in_RSI);
      *puVar6 = 0xffffffff;
    }
    local_1 = (_Bool)(bVar7 & 1);
  }
  return local_1;
}

Assistant:

bool array_array_container_lazy_xor(const array_container_t *src_1,
                                    const array_container_t *src_2,
                                    container_t **dst) {
    int totalCardinality = src_1->cardinality + src_2->cardinality;
    //
    // We assume that operations involving bitset containers will be faster than
    // operations involving solely array containers, except maybe when array
    // containers are small. Indeed, for example, it is cheap to compute the
    // exclusive union between an array and a bitset container, generally more
    // so than between a large array and another array. So it is advantageous to
    // favour bitset containers during the computation. Of course, if we convert
    // array containers eagerly to bitset containers, we may later need to
    // revert the bitset containers to array containerr to satisfy the Roaring
    // format requirements, but such one-time conversions at the end may not be
    // overly expensive. We arrived to this design based on extensive
    // benchmarking on unions. For XOR/exclusive union, we simply followed the
    // heuristic used by the unions (see  mixed_union.c). Further tuning is
    // possible.
    //
    if (totalCardinality <= ARRAY_LAZY_LOWERBOUND) {
        *dst = array_container_create_given_capacity(totalCardinality);
        if (*dst != NULL) array_container_xor(src_1, src_2, CAST_array(*dst));
        return false;  // not a bitset
    }
    *dst = bitset_container_from_array(src_1);
    bool returnval = true;  // expect a bitset (maybe, for XOR??)
    if (*dst != NULL) {
        bitset_container_t *ourbitset = CAST_bitset(*dst);
        bitset_flip_list(ourbitset->words, src_2->array, src_2->cardinality);
        ourbitset->cardinality = BITSET_UNKNOWN_CARDINALITY;
    }
    return returnval;
}